

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_3.h
# Opt level: O0

int linklist_5_3::create_tail(LinkList *list,int *a,int n)

{
  code *pcVar1;
  node *pnVar2;
  int local_34;
  int i;
  LinkList p;
  LinkList q;
  int n_local;
  int *a_local;
  LinkList *list_local;
  
  p = (LinkList)malloc(0x10);
  p->next = (node *)0x0;
  for (local_34 = 0; local_34 < n; local_34 = local_34 + 1) {
    pnVar2 = (node *)malloc(0x10);
    pnVar2->data = a[local_34];
    p->next = pnVar2;
    p = pnVar2;
  }
  ps_link_list(p);
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

int create_tail(LinkList &list, int *a, int n = 10) {
        LinkList q = newNode, p;
        q->next = nullptr;
        for (int i = 0; i < n; i++) {
            p = newNode;
            p->data = a[i];
            q->next = p;
            q = p;
        }
        ps_link_list(q);
    }